

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

string * __thiscall
spirv_cross::
join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[10],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [10],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,char (*ts_7) [3])

{
  StringStream<4096UL,_4096UL> stream;
  
  stream.saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.ptr =
       (Buffer *)&stream.saved_buffers.stack_storage;
  stream.current_buffer.size = 0;
  stream.current_buffer.buffer = (char *)0x0;
  stream.current_buffer.offset = 0;
  stream.saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
  buffer_size = 0;
  stream.saved_buffers.buffer_capacity = 8;
  StringStream<4096UL,_4096UL>::reset(&stream);
  StringStream<4096UL,_4096UL>::append(&stream,*(char **)this,*(size_t *)(this + 8));
  inner::
  join_helper<char_const(&)[2],std::__cxx11::string,char_const(&)[10],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
            (&stream,(char (*) [2])ts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
             (char (*) [10])ts_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3,
             (char (*) [3])ts_4,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_5,
             (char (*) [3])ts_6);
  StringStream<4096ul,4096ul>::str_abi_cxx11_(__return_storage_ptr__,&stream);
  StringStream<4096UL,_4096UL>::~StringStream(&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}